

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O2

idx_t duckdb_extract_statements
                (duckdb_connection connection,char *query,
                duckdb_extracted_statements *out_extracted_statements)

{
  duckdb_extracted_statements p_Var1;
  idx_t iVar2;
  allocator local_b9;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  local_b8;
  ErrorData error;
  
  if (out_extracted_statements == (duckdb_extracted_statements *)0x0 ||
      (query == (char *)0x0 || connection == (duckdb_connection)0x0)) {
    iVar2 = 0;
  }
  else {
    p_Var1 = (duckdb_extracted_statements)operator_new(0x38);
    *(pointer *)(p_Var1 + 0x10) = (pointer)0x0;
    *(undefined8 *)(p_Var1 + 0x18) = 0;
    *(undefined8 *)(p_Var1 + 0x30) = 0;
    *(pointer *)(p_Var1 + 0x20) = (pointer)0x0;
    *(pointer *)(p_Var1 + 0x28) = (pointer)0x0;
    *(undefined8 *)p_Var1 = 0;
    *(pointer *)(p_Var1 + 8) = (pointer)0x0;
    *(duckdb_extracted_statements *)(p_Var1 + 0x18) = p_Var1 + 0x28;
    p_Var1[0x28] = (_duckdb_extracted_statements)0x0;
    std::__cxx11::string::string((string *)&error,query,&local_b9);
    duckdb::Connection::ExtractStatements
              ((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                *)&local_b8,(Connection *)connection,(string *)&error);
    std::
    vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
    ::_M_move_assign((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                      *)p_Var1,&local_b8);
    std::
    vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
    ::~vector(&local_b8);
    std::__cxx11::string::~string((string *)&error);
    *out_extracted_statements = p_Var1;
    iVar2 = (long)*(pointer *)(p_Var1 + 8) - *(long *)p_Var1 >> 3;
  }
  return iVar2;
}

Assistant:

idx_t duckdb_extract_statements(duckdb_connection connection, const char *query,
                                duckdb_extracted_statements *out_extracted_statements) {
	if (!connection || !query || !out_extracted_statements) {
		return 0;
	}
	auto wrapper = new ExtractStatementsWrapper();
	Connection *conn = reinterpret_cast<Connection *>(connection);
	try {
		wrapper->statements = conn->ExtractStatements(query);
	} catch (const std::exception &ex) {
		ErrorData error(ex);
		wrapper->error = error.Message();
	}

	*out_extracted_statements = (duckdb_extracted_statements)wrapper;
	return wrapper->statements.size();
}